

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void lua_getfield(lua_State *L,int idx,char *k)

{
  TValue *t;
  size_t l;
  TValue *i_o;
  TValue key;
  Value local_28;
  undefined4 local_20;
  
  t = index2adr(L,idx);
  l = strlen(k);
  local_28.gc = (GCObject *)luaS_newlstr(L,k,l);
  local_20 = 4;
  luaV_gettable(L,t,(TValue *)&local_28,L->top);
  L->top = L->top + 1;
  return;
}

Assistant:

static void lua_getfield(lua_State*L,int idx,const char*k){
StkId t;
TValue key;
t=index2adr(L,idx);
api_checkvalidindex(L,t);
setsvalue(L,&key,luaS_new(L,k));
luaV_gettable(L,t,&key,L->top);
api_incr_top(L);
}